

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::clear(crn_comp *this)

{
  image_u8 (*paiVar1) [16];
  uint f;
  long lVar2;
  long lVar3;
  long lVar4;
  long local_50;
  long local_48;
  long local_40;
  
  this->m_pParams = (crn_comp_params *)0x0;
  paiVar1 = this->m_images;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 != 0x300; lVar4 = lVar4 + 0x30) {
      image<crnlib::color_quad<unsigned_char,_int>_>::clear
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                 ((long)&(*paiVar1)[0].m_width + lVar4));
    }
    paiVar1 = paiVar1 + 1;
  }
  this->m_has_subblocks = false;
  this->m_has_comp[0] = false;
  this->m_has_comp[1] = false;
  this->m_has_comp[2] = false;
  this->m_has_etc_color_blocks = false;
  vector<crnlib::crn_comp::level_details>::clear(&this->m_levels);
  this->m_total_blocks = 0;
  vector<unsigned_int>::clear(&this->m_color_endpoints);
  vector<unsigned_int>::clear(&this->m_alpha_endpoints);
  vector<unsigned_int>::clear(&this->m_color_selectors);
  vector<unsigned_long_long>::clear(&this->m_alpha_selectors);
  vector<crnlib::dxt_hc::endpoint_indices_details>::clear(&this->m_endpoint_indices);
  vector<crnlib::dxt_hc::selector_indices_details>::clear(&this->m_selector_indices);
  *(undefined8 *)((this->m_crn_header).m_alpha_selectors.m_ofs.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_tables_size.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_selectors.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_alpha_endpoints.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_userdata1.m_buf + 3) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_endpoints.m_num.m_buf + 1) = 0;
  (this->m_crn_header).m_levels = (uchar  [1])0x0;
  (this->m_crn_header).m_faces = (uchar  [1])0x0;
  (this->m_crn_header).m_format = (uchar  [1])0x0;
  (this->m_crn_header).m_flags = (uchar  [2])0x0;
  (this->m_crn_header).m_reserved.m_buf[0] = '\0';
  (this->m_crn_header).m_reserved.m_buf[1] = '\0';
  (this->m_crn_header).m_reserved.m_buf[2] = '\0';
  *(undefined8 *)((this->m_crn_header).m_reserved.m_buf + 3) = 0;
  (this->m_crn_header).m_sig = (uchar  [2])0x0;
  (this->m_crn_header).m_header_size = (uchar  [2])0x0;
  (this->m_crn_header).m_header_crc16 = (uchar  [2])0x0;
  (this->m_crn_header).m_data_size.m_buf[0] = '\0';
  (this->m_crn_header).m_data_size.m_buf[1] = '\0';
  *(undefined8 *)((this->m_crn_header).m_data_size.m_buf + 2) = 0;
  vector<unsigned_char>::clear(&this->m_comp_data);
  dxt_hc::clear(&this->m_hvq);
  vector<unsigned_int>::clear(&(this->m_reference_hist).m_hist);
  static_huffman_data_model::clear(&this->m_reference_dm);
  lVar2 = 0x2650;
  local_40 = 0x2670;
  local_48 = 0x2700;
  local_50 = 0x2720;
  lVar4 = 0x2740;
  for (lVar3 = 0x2690; lVar3 != 0x2700; lVar3 = lVar3 + 0x38) {
    vector<unsigned_short>::clear
              ((vector<unsigned_short> *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + lVar2 + -0x10));
    vector<unsigned_int>::clear
              ((vector<unsigned_int> *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + local_40 + -0x10));
    static_huffman_data_model::clear
              ((static_huffman_data_model *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + lVar3 + -0x10));
    vector<unsigned_short>::clear
              ((vector<unsigned_short> *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + local_48 + -0x10));
    vector<unsigned_int>::clear
              ((vector<unsigned_int> *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + local_50 + -0x10));
    static_huffman_data_model::clear
              ((static_huffman_data_model *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + lVar4 + -0x10));
    lVar2 = lVar2 + 0x10;
    local_40 = local_40 + 0x10;
    local_48 = local_48 + 0x10;
    local_50 = local_50 + 0x10;
    lVar4 = lVar4 + 0x38;
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 0x10) {
    vector<unsigned_char>::clear
              ((vector<unsigned_char> *)((long)&this->m_packed_blocks[0].m_p + lVar2));
  }
  vector<unsigned_char>::clear(&this->m_packed_data_models);
  vector<unsigned_char>::clear(&this->m_packed_color_endpoints);
  vector<unsigned_char>::clear(&this->m_packed_color_selectors);
  vector<unsigned_char>::clear(&this->m_packed_alpha_endpoints);
  vector<unsigned_char>::clear(&this->m_packed_alpha_selectors);
  return;
}

Assistant:

void crn_comp::clear() {
  m_pParams = NULL;

  for (uint f = 0; f < cCRNMaxFaces; f++)
    for (uint l = 0; l < cCRNMaxLevels; l++)
      m_images[f][l].clear();

  utils::zero_object(m_has_comp);
  m_has_etc_color_blocks = false;
  m_has_subblocks = false;

  m_levels.clear();

  m_total_blocks = 0;
  m_color_endpoints.clear();
  m_alpha_endpoints.clear();
  m_color_selectors.clear();
  m_alpha_selectors.clear();
  m_endpoint_indices.clear();
  m_selector_indices.clear();

  utils::zero_object(m_crn_header);

  m_comp_data.clear();

  m_hvq.clear();

  m_reference_hist.clear();
  m_reference_dm.clear();
  for (uint i = 0; i < 2; i++) {
    m_endpoint_remaping[i].clear();
    m_endpoint_index_hist[i].clear();
    m_endpoint_index_dm[i].clear();
    m_selector_remaping[i].clear();
    m_selector_index_hist[i].clear();
    m_selector_index_dm[i].clear();
  }

  for (uint i = 0; i < cCRNMaxLevels; i++)
    m_packed_blocks[i].clear();

  m_packed_data_models.clear();

  m_packed_color_endpoints.clear();
  m_packed_color_selectors.clear();
  m_packed_alpha_endpoints.clear();
  m_packed_alpha_selectors.clear();
}